

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Octree.h
# Opt level: O2

void __thiscall
Parfait::Octree<Parfait::Facet>::insert
          (Octree<Parfait::Facet> *this,int voxel_index,int object_index)

{
  vector<Parfait::Octree<Parfait::Facet>::Node,_std::allocator<Parfait::Octree<Parfait::Facet>::Node>_>
  *this_00;
  int voxel_index_00;
  int *piVar1;
  bool bVar2;
  reference pvVar3;
  reference this_01;
  int *piVar4;
  long lVar5;
  size_type __n;
  vector<Parfait::Facet_*,_std::allocator<Parfait::Facet_*>_> inside;
  Extent<double> extent;
  int local_9c;
  _Vector_base<Parfait::Facet_*,_std::allocator<Parfait::Facet_*>_> local_98;
  undefined8 uStack_80;
  pointer local_70;
  Extent<double> local_68;
  
  this_00 = &this->voxels;
  __n = (size_type)voxel_index;
  local_9c = object_index;
  pvVar3 = std::
           vector<Parfait::Octree<Parfait::Facet>::Node,_std::allocator<Parfait::Octree<Parfait::Facet>::Node>_>
           ::at(this_00,__n);
  local_68.lo.pos._M_elems[0] = (pvVar3->extent).lo.pos._M_elems[0];
  local_68.lo.pos._M_elems[1] = (pvVar3->extent).lo.pos._M_elems[1];
  local_68.lo.pos._M_elems[2] = (pvVar3->extent).lo.pos._M_elems[2];
  local_68.hi.pos._M_elems[0] = (pvVar3->extent).hi.pos._M_elems[0];
  local_68.hi.pos._M_elems[1] = (pvVar3->extent).hi.pos._M_elems[1];
  local_68.hi.pos._M_elems[2] = (pvVar3->extent).hi.pos._M_elems[2];
  this_01 = std::vector<Parfait::Facet,_std::allocator<Parfait::Facet>_>::at
                      (&this->objects,(long)object_index);
  bVar2 = Facet::intersects(this_01,&local_68);
  if (bVar2) {
    pvVar3 = std::
             vector<Parfait::Octree<Parfait::Facet>::Node,_std::allocator<Parfait::Octree<Parfait::Facet>::Node>_>
             ::at(this_00,__n);
    pvVar3->filled = true;
    pvVar3 = std::
             vector<Parfait::Octree<Parfait::Facet>::Node,_std::allocator<Parfait::Octree<Parfait::Facet>::Node>_>
             ::at(this_00,__n);
    bVar2 = Node::isLeaf(pvVar3);
    if (bVar2) {
      pvVar3 = std::
               vector<Parfait::Octree<Parfait::Facet>::Node,_std::allocator<Parfait::Octree<Parfait::Facet>::Node>_>
               ::at(this_00,__n);
      std::vector<int,_std::allocator<int>_>::push_back(&pvVar3->inside_objects,&local_9c);
      bVar2 = atMaxDepth(this,voxel_index);
      if (!bVar2) {
        local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pvVar3 = std::
                 vector<Parfait::Octree<Parfait::Facet>::Node,_std::allocator<Parfait::Octree<Parfait::Facet>::Node>_>
                 ::at(this_00,__n);
        std::vector<Parfait::Facet_*,_std::allocator<Parfait::Facet_*>_>::reserve
                  ((vector<Parfait::Facet_*,_std::allocator<Parfait::Facet_*>_> *)&local_98,
                   (long)(pvVar3->inside_objects).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(pvVar3->inside_objects).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 2);
        pvVar3 = std::
                 vector<Parfait::Octree<Parfait::Facet>::Node,_std::allocator<Parfait::Octree<Parfait::Facet>::Node>_>
                 ::at(this_00,__n);
        piVar1 = (pvVar3->inside_objects).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (piVar4 = (pvVar3->inside_objects).super__Vector_base<int,_std::allocator<int>_>._M_impl
                      .super__Vector_impl_data._M_start; piVar4 != piVar1; piVar4 = piVar4 + 1) {
          local_70 = (this->objects).
                     super__Vector_base<Parfait::Facet,_std::allocator<Parfait::Facet>_>._M_impl.
                     super__Vector_impl_data._M_start + *piVar4;
          std::vector<Parfait::Facet*,std::allocator<Parfait::Facet*>>::
          emplace_back<Parfait::Facet*>
                    ((vector<Parfait::Facet*,std::allocator<Parfait::Facet*>> *)&local_98,&local_70)
          ;
        }
        bVar2 = std::
                function<bool_(std::vector<Parfait::Facet_*,_std::allocator<Parfait::Facet_*>_>_&)>
                ::operator()(&this->should_split,
                             (vector<Parfait::Facet_*,_std::allocator<Parfait::Facet_*>_> *)
                             &local_98);
        if (bVar2) {
          splitVoxel(this,voxel_index);
        }
        std::_Vector_base<Parfait::Facet_*,_std::allocator<Parfait::Facet_*>_>::~_Vector_base
                  (&local_98);
      }
    }
    else {
      pvVar3 = std::
               vector<Parfait::Octree<Parfait::Facet>::Node,_std::allocator<Parfait::Octree<Parfait::Facet>::Node>_>
               ::at(this_00,__n);
      local_98._M_impl.super__Vector_impl_data._M_start = *(pointer *)(pvVar3->children)._M_elems;
      local_98._M_impl.super__Vector_impl_data._M_finish =
           *(pointer *)((pvVar3->children)._M_elems + 2);
      local_98._M_impl.super__Vector_impl_data._M_end_of_storage =
           *(pointer *)((pvVar3->children)._M_elems + 4);
      uStack_80 = *(undefined8 *)((pvVar3->children)._M_elems + 6);
      for (lVar5 = 0; lVar5 != 0x20; lVar5 = lVar5 + 4) {
        voxel_index_00 = *(int *)((long)&local_98._M_impl.super__Vector_impl_data._M_start + lVar5);
        if (voxel_index_00 != -0xb) {
          insert(this,voxel_index_00,object_index);
        }
      }
    }
  }
  return;
}

Assistant:

inline void insert(int voxel_index, int object_index) {
          const auto extent = voxels.at(voxel_index).extent;
          if(objects.at(object_index).intersects(extent)) {
              voxels.at(voxel_index).filled = true;
              if(voxels.at(voxel_index).isLeaf()) {
                  voxels.at(voxel_index).inside_objects.push_back(object_index);
                  if(not atMaxDepth(voxel_index)) {
                      std::vector<T*> inside;
                      inside.reserve(voxels.at(voxel_index).inside_objects.size());
                      for(auto i : voxels.at(voxel_index).inside_objects){
                          inside.push_back(&objects[i]);
                      }
                      if(should_split(inside)) {
                          splitVoxel(voxel_index);
                      }
                  }
              }
              else {
                  auto children = voxels.at(voxel_index).children;
                  for (auto child : children) {
                      if(child != Node::EMPTY)
                          insert(child, object_index);
                  }
              }
          }
      }